

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::updateMonthMenu(QCalendarWidgetPrivate *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  QAction **ppQVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  bool monthEnabled;
  bool nextEnabled;
  bool prevEnabled;
  int end;
  int beg;
  int maxMonths;
  int i;
  QCalendar cal;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 enable;
  undefined4 in_stack_ffffffffffffff98;
  int iVar7;
  int local_44;
  
  enable = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QCalendar::monthsInYear((int)*(undefined8 *)(in_RDI + 0xf) + 0x18);
  uVar5 = QtPrivate::QCalendarModel::calendar
                    ((QCalendarModel *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                    );
  iVar7 = *(int *)(*(long *)(in_RDI + 0xf) + 0x38);
  iVar3 = QDate::year(*(long *)(in_RDI + 0xf) + 0x28,uVar5);
  if (iVar7 == iVar3) {
    QDate::month(*(long *)(in_RDI + 0xf) + 0x28,uVar5);
    enable = (undefined1)((uint)*(undefined4 *)(*(long *)(in_RDI + 0xf) + 0x3c) >> 0x18);
    QDate::month(*(long *)(in_RDI + 0xf) + 0x28,uVar5);
  }
  iVar3 = *(int *)(*(long *)(in_RDI + 0xf) + 0x38);
  iVar4 = QDate::year(*(long *)(in_RDI + 0xf) + 0x30,uVar5);
  if (iVar3 == iVar4) {
    QDate::month(*(long *)(in_RDI + 0xf) + 0x30,uVar5);
    QDate::month(*(long *)(in_RDI + 0xf) + 0x30,uVar5);
  }
  QWidget::setEnabled(in_RDI,(bool)enable);
  QWidget::setEnabled(in_RDI,(bool)enable);
  for (local_44 = 1; local_44 <= iVar2; local_44 = local_44 + 1) {
    ppQVar6 = QMap<int,_QAction_*>::operator[]
                        ((QMap<int,_QAction_*> *)CONCAT44(iVar7,in_stack_ffffffffffffff98),
                         (int *)in_RDI);
    QAction::setEnabled(SUB81(*ppQVar6,0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidgetPrivate::updateMonthMenu()
{
    int maxMonths = m_model->m_calendar.monthsInYear(m_model->m_shownYear);
    int beg = 1, end = maxMonths;
    bool prevEnabled = true;
    bool nextEnabled = true;
    QCalendar cal = m_model->calendar();
    if (m_model->m_shownYear == m_model->m_minimumDate.year(cal)) {
        beg = m_model->m_minimumDate.month(cal);
        if (m_model->m_shownMonth == m_model->m_minimumDate.month(cal))
            prevEnabled = false;
    }
    if (m_model->m_shownYear == m_model->m_maximumDate.year(cal)) {
        end = m_model->m_maximumDate.month(cal);
        if (m_model->m_shownMonth == m_model->m_maximumDate.month(cal))
            nextEnabled = false;
    }
    prevMonth->setEnabled(prevEnabled);
    nextMonth->setEnabled(nextEnabled);
    for (int i = 1; i <= maxMonths; i++) {
        bool monthEnabled = true;
        if (i < beg || i > end)
            monthEnabled = false;
        monthToAction[i]->setEnabled(monthEnabled);
    }
}